

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGlobalGenerator *pcVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_> this_00;
  tuple<cmMakefile_*,_std::default_delete<cmMakefile>_> this_01;
  string *psVar8;
  cmTarget *this_02;
  cmGeneratorTarget *this_03;
  cmLocalGenerator *this_04;
  long *plVar9;
  size_type *psVar10;
  char *__format;
  size_type __rlen;
  string *lib;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string_view name;
  cmLinkLineComputer linkLineComputer;
  string includeFlags;
  string libs;
  __uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_1f0;
  string buildType;
  string linkLibs;
  __single_object mfu;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> local_1a0;
  string packageName;
  string mode;
  string language;
  string linkPath;
  string frameworkPath;
  undefined1 local_f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  cmList libList;
  string linkFlags;
  string flags;
  string systemFile;
  cmStateSnapshot snapshot;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,(string *)&linkLineComputer);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,(string *)&linkLineComputer);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  this_00.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       operator_new(0x6f8);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)
             this_00.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,this);
  local_1f0._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       this_00.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                          &local_1f0);
  if ((_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
      local_1f0._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl != (cmGlobalGenerator *)0x0) {
    (**(code **)(*(long *)local_1f0._M_t.
                          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
  }
  local_1f0._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)0x0;
  snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
  snapshot.State = (this->CurrentSnapshot).State;
  snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&linkLineComputer,&snapshot);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&linkLineComputer,&includeFlags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&linkLineComputer,&snapshot);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&linkLineComputer,&includeFlags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
    operator_delete(includeFlags._M_dataplus._M_p,includeFlags.field_2._M_allocated_capacity + 1);
  }
  cmStateSnapshot::SetDefaultDefinitions(&snapshot);
  pcVar3 = (this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)operator_new(0xdc0);
  cmMakefile::cmMakefile
            ((cmMakefile *)
             this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,pcVar3,&snapshot);
  mfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmMakefile,_std::default_delete<cmMakefile>,_true,_true>)
       (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)0x0;
  local_1a0._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
       (tuple<cmMakefile_*,_std::default_delete<cmMakefile>_>)
       this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  cmGlobalGenerator::AddMakefile
            ((this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
             (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_1a0);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_1a0);
  cmMakefile::SetArgcArgv
            ((cmMakefile *)
             this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,args);
  name._M_str = "CMakeFindPackageMode.cmake";
  name._M_len = 0x1a;
  cmMakefile::GetModulesFile_abi_cxx11_
            (&systemFile,
             (cmMakefile *)
             this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,name);
  cmMakefile::ReadListFile
            ((cmMakefile *)
             this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&systemFile);
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"LANGUAGE","");
  psVar8 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                      .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                      (string *)&linkLineComputer);
  language._M_dataplus._M_p = (pointer)&language.field_2;
  pcVar4 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&language,pcVar4,pcVar4 + psVar8->_M_string_length);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"MODE","");
  psVar8 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                      .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                      (string *)&linkLineComputer);
  mode._M_dataplus._M_p = (pointer)&mode.field_2;
  pcVar4 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&mode,pcVar4,pcVar4 + psVar8->_M_string_length);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"NAME","");
  psVar8 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      this_01.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                      .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                      (string *)&linkLineComputer);
  packageName._M_dataplus._M_p = (pointer)&packageName.field_2;
  pcVar4 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&packageName,pcVar4,pcVar4 + psVar8->_M_string_length);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"PACKAGE_FOUND","");
  bVar5 = cmMakefile::IsOn((cmMakefile *)
                           this_01.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                           (string *)&linkLineComputer);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  linkLineComputer._vptr_cmLinkLineComputer =
       (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"PACKAGE_QUIET","");
  bVar6 = cmMakefile::IsOn((cmMakefile *)
                           this_01.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                           (string *)&linkLineComputer);
  if (linkLineComputer._vptr_cmLinkLineComputer !=
      (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
    operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                    linkLineComputer.StateDir.DirectoryState.Position + 1);
  }
  if (bVar5) {
    if (mode._M_string_length == 4) {
      iVar7 = bcmp(mode._M_dataplus._M_p,"LINK",4);
      if (iVar7 == 0) {
        srcs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        srcs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        srcs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char_const*>((string *)&linkLineComputer,"dummy","");
        this_02 = cmMakefile::AddExecutable
                            ((cmMakefile *)
                             this_01.
                             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                             (string *)&linkLineComputer,&srcs,true);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkLineComputer,"LINKER_LANGUAGE","");
        cmTarget::SetProperty(this_02,(string *)&linkLineComputer,&language);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkLineComputer,"PACKAGE_LIBRARIES","");
        psVar8 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            this_01.
                            super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                            (string *)&linkLineComputer);
        libs._M_dataplus._M_p = (pointer)&libs.field_2;
        pcVar4 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&libs,pcVar4,pcVar4 + psVar8->_M_string_length);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&linkLineComputer,libs._M_dataplus._M_p,
                   libs._M_dataplus._M_p + libs._M_string_length);
        init._M_len = 1;
        init._M_array = (iterator)&linkLineComputer;
        cmList::cmList(&libList,init);
        psVar8 = libList.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
          psVar8 = libList.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; psVar8 != libList.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
          cmTarget::AddLinkLibrary
                    (this_02,(cmMakefile *)
                             this_01.
                             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,psVar8,
                     GENERAL_LibraryType);
        }
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkLineComputer,"CMAKE_BUILD_TYPE","");
        psVar8 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            this_01.
                            super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                            (string *)&linkLineComputer);
        buildType._M_dataplus._M_p = (pointer)&buildType.field_2;
        pcVar4 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&buildType,pcVar4,pcVar4 + psVar8->_M_string_length);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        cmsys::SystemTools::UpperCase((string *)&linkLineComputer,&buildType);
        std::__cxx11::string::operator=((string *)&buildType,(string *)&linkLineComputer);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
        linkLibs._M_string_length = 0;
        linkLibs.field_2._M_local_buf[0] = '\0';
        frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
        frameworkPath._M_string_length = 0;
        frameworkPath.field_2._M_local_buf[0] = '\0';
        linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
        linkPath._M_string_length = 0;
        linkPath.field_2._M_local_buf[0] = '\0';
        flags._M_string_length = 0;
        flags.field_2._M_local_buf[0] = '\0';
        linkFlags._M_string_length = 0;
        linkFlags.field_2._M_local_buf[0] = '\0';
        linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
        flags._M_dataplus._M_p = (pointer)&flags.field_2;
        cmGlobalGenerator::CreateGenerationObjects
                  ((this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,AllTargets);
        pcVar3 = (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        psVar8 = cmTarget::GetName_abi_cxx11_(this_02);
        this_03 = cmGlobalGenerator::FindGeneratorTarget(pcVar3,psVar8);
        this_04 = cmGeneratorTarget::GetLocalGenerator(this_03);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_f8,this_04);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)&includeFlags,(cmStateSnapshot *)local_f8)
        ;
        cmLinkLineComputer::cmLinkLineComputer
                  (&linkLineComputer,&this_04->super_cmOutputConverter,
                   (cmStateDirectory *)&includeFlags);
        cmLocalGenerator::GetTargetFlags
                  (this_04,&linkLineComputer,&buildType,&linkLibs,&flags,&linkFlags,&frameworkPath,
                   &linkPath,this_03);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,&frameworkPath,&linkPath);
        plVar9 = (long *)std::__cxx11::string::_M_append(local_f8,(ulong)linkLibs._M_dataplus._M_p);
        psVar10 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar10) {
          includeFlags.field_2._M_allocated_capacity = *psVar10;
          includeFlags.field_2._8_8_ = plVar9[3];
          includeFlags._M_dataplus._M_p = (pointer)&includeFlags.field_2;
        }
        else {
          includeFlags.field_2._M_allocated_capacity = *psVar10;
          includeFlags._M_dataplus._M_p = (pointer)*plVar9;
        }
        includeFlags._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)&linkLibs,(string *)&includeFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includeFlags._M_dataplus._M_p != &includeFlags.field_2) {
          operator_delete(includeFlags._M_dataplus._M_p,
                          includeFlags.field_2._M_allocated_capacity + 1);
        }
        if ((cmState *)local_f8._0_8_ != (cmState *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
        }
        puts(linkLibs._M_dataplus._M_p);
        cmLinkLineComputer::~cmLinkLineComputer(&linkLineComputer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
          operator_delete(linkFlags._M_dataplus._M_p,
                          CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                                   linkFlags.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)flags._M_dataplus._M_p != &flags.field_2) {
          operator_delete(flags._M_dataplus._M_p,
                          CONCAT71(flags.field_2._M_allocated_capacity._1_7_,
                                   flags.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
          operator_delete(linkPath._M_dataplus._M_p,
                          CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                   linkPath.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
          operator_delete(frameworkPath._M_dataplus._M_p,
                          CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                                   frameworkPath.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
          operator_delete(linkLibs._M_dataplus._M_p,
                          CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                                   linkLibs.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buildType._M_dataplus._M_p != &buildType.field_2) {
          operator_delete(buildType._M_dataplus._M_p,buildType.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&libList.Values);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libs._M_dataplus._M_p != &libs.field_2) {
          operator_delete(libs._M_dataplus._M_p,
                          CONCAT71(libs.field_2._M_allocated_capacity._1_7_,
                                   libs.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&srcs);
      }
      goto LAB_003038f4;
    }
    if (mode._M_string_length == 7) {
      iVar7 = bcmp(mode._M_dataplus._M_p,"COMPILE",7);
      if (iVar7 == 0) {
        paVar1 = &includeFlags.field_2;
        includeFlags._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&includeFlags,"PACKAGE_INCLUDE_DIRS","");
        psVar8 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            this_01.
                            super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includeFlags);
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        pcVar4 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&linkLineComputer,pcVar4,pcVar4 + psVar8->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includeFlags._M_dataplus._M_p != paVar1) {
          operator_delete(includeFlags._M_dataplus._M_p,
                          includeFlags.field_2._M_allocated_capacity + 1);
        }
        includeFlags._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&includeFlags,linkLineComputer._vptr_cmLinkLineComputer,
                   (long)&((linkLineComputer.StateDir.DirectoryState.Tree)->Data).
                          super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   (long)linkLineComputer._vptr_cmLinkLineComputer);
        init_00._M_len = 1;
        init_00._M_array = &includeFlags;
        cmList::cmList((cmList *)&linkLibs,init_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includeFlags._M_dataplus._M_p != paVar1) {
          operator_delete(includeFlags._M_dataplus._M_p,
                          includeFlags.field_2._M_allocated_capacity + 1);
        }
        cmGlobalGenerator::CreateGenerationObjects
                  ((this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,AllTargets);
        paVar2 = &libs.field_2;
        libs._M_string_length = 0;
        libs.field_2._M_local_buf[0] = '\0';
        libs._M_dataplus._M_p = (pointer)paVar2;
        cmLocalGenerator::GetIncludeFlags
                  (&includeFlags,
                   (cmLocalGenerator *)
                   **(undefined8 **)
                     &(((this->GlobalGenerator)._M_t.
                        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                        .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->
                      LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&linkLibs,(cmGeneratorTarget *)0x0,&language,&libs,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libs._M_dataplus._M_p != paVar2) {
          operator_delete(libs._M_dataplus._M_p,
                          CONCAT71(libs.field_2._M_allocated_capacity._1_7_,
                                   libs.field_2._M_local_buf[0]) + 1);
        }
        buildType._M_dataplus._M_p = (pointer)&buildType.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&buildType,"PACKAGE_DEFINITIONS","");
        psVar8 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            this_01.
                            super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&buildType);
        pcVar4 = (psVar8->_M_dataplus)._M_p;
        libs._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&libs,pcVar4,pcVar4 + psVar8->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buildType._M_dataplus._M_p != &buildType.field_2) {
          operator_delete(buildType._M_dataplus._M_p,buildType.field_2._M_allocated_capacity + 1);
        }
        printf("%s %s\n",includeFlags._M_dataplus._M_p,libs._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libs._M_dataplus._M_p != paVar2) {
          operator_delete(libs._M_dataplus._M_p,
                          CONCAT71(libs.field_2._M_allocated_capacity._1_7_,
                                   libs.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)includeFlags._M_dataplus._M_p != paVar1) {
          operator_delete(includeFlags._M_dataplus._M_p,
                          includeFlags.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&linkLibs);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
      }
      goto LAB_003038f4;
    }
    if (((mode._M_string_length != 5) || (iVar7 = bcmp(mode._M_dataplus._M_p,"EXIST",5), iVar7 != 0)
        ) || (bVar6)) goto LAB_003038f4;
    __format = "%s found.\n";
  }
  else {
    if (bVar6) goto LAB_003038f4;
    __format = "%s not found.\n";
  }
  printf(__format,packageName._M_dataplus._M_p);
LAB_003038f4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)packageName._M_dataplus._M_p != &packageName.field_2) {
    operator_delete(packageName._M_dataplus._M_p,packageName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mode._M_dataplus._M_p != &mode.field_2) {
    operator_delete(mode._M_dataplus._M_p,mode.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)systemFile._M_dataplus._M_p != &systemFile.field_2) {
    operator_delete(systemFile._M_dataplus._M_p,systemFile.field_2._M_allocated_capacity + 1);
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&mfu);
  return bVar5;
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  this->SetGlobalGenerator(cm::make_unique<cmGlobalGenerator>(this));

  cmStateSnapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(
    cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource(
    cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  auto mfu = cm::make_unique<cmMakefile>(this->GetGlobalGenerator(), snapshot);
  cmMakefile* mf = mfu.get();
  this->GlobalGenerator->AddMakefile(std::move(mfu));

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile);

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound) {
    if (!quiet) {
      printf("%s not found.\n", packageName.c_str());
    }
  } else if (mode == "EXIST"_s) {
    if (!quiet) {
      printf("%s found.\n", packageName.c_str());
    }
  } else if (mode == "COMPILE"_s) {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    cmList includeDirs{ includes };

    this->GlobalGenerator->CreateGenerationObjects();
    const auto& lg = this->GlobalGenerator->LocalGenerators[0];
    std::string includeFlags =
      lg->GetIncludeFlags(includeDirs, nullptr, language, std::string());

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
  } else if (mode == "LINK"_s) {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language);

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    cmList libList{ libs };
    for (std::string const& lib : libList) {
      tgt->AddLinkLibrary(*mf, lib, GENERAL_LibraryType);
    }

    std::string buildType = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
    buildType = cmSystemTools::UpperCase(buildType);

    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    this->GlobalGenerator->CreateGenerationObjects();
    cmGeneratorTarget* gtgt =
      this->GlobalGenerator->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, buildType, linkLibs, flags,
                       linkFlags, frameworkPath, linkPath, gtgt);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str());

    /*    if ( use_win32 )
          {
          tgt->SetProperty("WIN32_EXECUTABLE", "ON");
          }
        if ( use_macbundle)
          {
          tgt->SetProperty("MACOSX_BUNDLE", "ON");
          }*/
  }

  return packageFound;
}